

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckColumns(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  ctmbstr pString;
  ctmbstr word;
  Bool isMissingHeader;
  int numTH;
  Node *tnode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  word._4_4_ = 0;
  bVar1 = false;
  (doc->access).CheckedHeaders = (doc->access).CheckedHeaders + 1;
  if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
     (node->content->tag->id == TidyTag_TH)) {
    (doc->access).HasTH = yes;
    for (_isMissingHeader = node->content; _isMissingHeader != (Node *)0x0;
        _isMissingHeader = _isMissingHeader->next) {
      if (((_isMissingHeader == (Node *)0x0) || (_isMissingHeader->tag == (Dict *)0x0)) ||
         (_isMissingHeader->tag->id != TidyTag_TH)) {
        bVar1 = true;
      }
      else {
        BVar2 = prvTidynodeIsText(_isMissingHeader->content);
        if (BVar2 != no) {
          pString = textFromOneNode(doc,_isMissingHeader->content);
          BVar2 = IsWhitespace(pString);
          if (BVar2 == no) {
            word._4_4_ = word._4_4_ + 1;
          }
        }
      }
    }
  }
  if ((!bVar1) && (0 < word._4_4_)) {
    (doc->access).HasValidColumnHeaders = yes;
  }
  if ((bVar1) && (1 < word._4_4_)) {
    (doc->access).HasInvalidColumnHeader = yes;
  }
  return;
}

Assistant:

static void CheckColumns( TidyDocImpl* doc, Node* node )
{
    Node* tnode;
    int numTH = 0;
    Bool isMissingHeader = no;

    doc->access.CheckedHeaders++;

    /* Table must have row of headers if headers for columns don't exist */
    if ( nodeIsTH(node->content) )
    {
        doc->access.HasTH = yes;

        for ( tnode = node->content; tnode; tnode = tnode->next )
        {
            if ( nodeIsTH(tnode) )
            {
                if ( TY_(nodeIsText)(tnode->content) )
                {
                    ctmbstr word = textFromOneNode( doc, tnode->content);
                    if ( !IsWhitespace(word) )
                        numTH++;
                }
            }
            else
            {
                isMissingHeader = yes;
            }
        }
    }

    if ( !isMissingHeader && numTH > 0 )
        doc->access.HasValidColumnHeaders = yes;

    if ( isMissingHeader && numTH >= 2 )
        doc->access.HasInvalidColumnHeader = yes;
}